

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialogbuttonbox.cpp
# Opt level: O1

void QDialogButtonBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  uint *puVar2;
  long lVar3;
  QFlagsStorage<QDialogButtonBox::StandardButton> *pQVar4;
  void **ppvVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_40 = *_a[1];
      puStack_30 = &local_40;
      ppvVar5 = &local_38;
      local_38 = (void *)0x0;
      iVar6 = 0;
      goto LAB_0047812f;
    case 1:
      iVar6 = 1;
      break;
    case 2:
      iVar6 = 2;
      break;
    case 3:
      iVar6 = 3;
      break;
    default:
      goto switchD_004780c2_default;
    }
    ppvVar5 = (void **)0x0;
LAB_0047812f:
    QMetaObject::activate(_o,&staticMetaObject,iVar6,ppvVar5);
switchD_004780c2_default:
    if (_c == ReadProperty) goto switchD_004780a6_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_004780a6_caseD_3;
      goto switchD_004780a6_caseD_5;
    }
    break;
  case ReadProperty:
switchD_004780a6_caseD_1:
    puVar2 = (uint *)*_a;
    if (_id == 2) {
      *(undefined1 *)puVar2 = *(undefined1 *)(*(long *)(_o + 8) + 0x468);
    }
    else if (_id == 1) {
      lVar3 = *(long *)(*(long *)(_o + 8) + 0x390);
      if (lVar3 == 0) {
        uVar7 = 0;
      }
      else {
        lVar8 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 | *(uint *)(*(long *)(*(long *)(_o + 8) + 0x398) + lVar8);
          lVar8 = lVar8 + 4;
        } while (lVar3 << 2 != lVar8);
      }
      *puVar2 = uVar7;
    }
    else if (_id == 0) {
      *puVar2 = *(uint *)(*(long *)(_o + 8) + 0x450);
    }
    if (_c != WriteProperty) goto switchD_004780a6_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_004780a6_caseD_3;
  case IndexOfMethod:
switchD_004780a6_caseD_5:
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == clicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_004780a6_caseD_3;
    }
    if (((code *)*plVar1 == accepted) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_004780a6_caseD_3;
    }
    if (((code *)*plVar1 == helpRequested) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_004780a6_caseD_3;
    }
    if (((code *)*plVar1 == rejected) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_004780a6_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_004780a6_caseD_3;
      goto switchD_004780a6_caseD_1;
    }
  }
  pQVar4 = (QFlagsStorage<QDialogButtonBox::StandardButton> *)*_a;
  if (_id == 2) {
    setCenterButtons((QDialogButtonBox *)_o,*(bool *)&pQVar4->i);
  }
  else if (_id == 1) {
    setStandardButtons((QDialogButtonBox *)_o,(StandardButtons)pQVar4->i);
  }
  else if (_id == 0) {
    setOrientation((QDialogButtonBox *)_o,pQVar4->i);
  }
switchD_004780a6_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialogButtonBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->helpRequested(); break;
        case 3: _t->rejected(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)(QAbstractButton * )>(_a, &QDialogButtonBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::helpRequested, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::rejected, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: QtMocHelpers::assignFlags<StandardButtons>(_v, _t->standardButtons()); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->centerButtons(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 1: _t->setStandardButtons(*reinterpret_cast<StandardButtons*>(_v)); break;
        case 2: _t->setCenterButtons(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}